

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O1

QString * operator+=(QString *a,
                    QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QLatin1String,_QString_&>,_QLatin1String>,_QLatin1Char>,_QString>,_QLatin1Char>,_QString_&>,_QLatin1String>,_QLatin1String>
                    *b)

{
  ArrayOptions *pAVar1;
  QLatin1String *pQVar2;
  Data *pDVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long in_FS_OFFSET;
  QChar *it;
  QChar *local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar3 = (a->d).d;
  lVar10 = (a->d).size;
  lVar11 = *(long *)&(b->a).a.a.a.a.a.a;
  lVar4 = ((*(QString **)((long)&(b->a).a.a.a.a.a.a + 0x10))->d).size;
  lVar5 = (b->a).a.a.a.a.a.b.m_size;
  lVar6 = (b->a).a.a.a.b.d.size;
  lVar7 = (((b->a).a.b)->d).size;
  lVar8 = (b->b).m_size;
  lVar9 = (b->a).b.m_size;
  if ((pDVar3 == (Data *)0x0) ||
     (1 < (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
    QString::reallocData((longlong)a,(AllocationOption)lVar10);
  }
  lVar10 = lVar8 + lVar11 + lVar10 + lVar4 + lVar5 + lVar6 + lVar7 + lVar9 + 2;
  pDVar3 = (a->d).d;
  if (pDVar3 == (Data *)0x0) {
    lVar11 = 0;
  }
  else {
    lVar11 = (pDVar3->super_QArrayData).alloc -
             (((long)((long)(a->d).ptr -
                     ((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0))
              >> 1) + (a->d).size);
  }
  if (lVar11 < lVar10) {
    if (pDVar3 == (Data *)0x0) {
      lVar11 = 0;
    }
    else {
      lVar11 = (pDVar3->super_QArrayData).alloc * 2;
    }
    if (lVar11 < lVar10) {
      lVar11 = lVar10;
    }
    if (((pDVar3 == (Data *)0x0) ||
        (1 < (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) ||
       ((pDVar3->super_QArrayData).alloc -
        ((long)((long)(a->d).ptr -
               ((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 1)
        <= lVar11)) {
      lVar10 = (a->d).size;
      if (lVar11 < lVar10) {
        lVar11 = lVar10;
      }
      QString::reallocData((longlong)a,(AllocationOption)lVar11);
    }
    pDVar3 = (a->d).d;
    if ((pDVar3 != (Data *)0x0) && ((pDVar3->super_QArrayData).alloc != 0)) {
      pAVar1 = &(pDVar3->super_QArrayData).flags;
      *(byte *)&(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
                super_QFlagsStorage<QArrayData::ArrayOption>.i =
           (byte)(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
                 super_QFlagsStorage<QArrayData::ArrayOption>.i | 1;
    }
  }
  pDVar3 = (a->d).d;
  if ((pDVar3 == (Data *)0x0) ||
     (1 < (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
    QString::reallocData((longlong)a,(AllocationOption)(a->d).size);
  }
  local_38 = (QChar *)((a->d).ptr + (a->d).size);
  QConcatenable<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QLatin1String,_QString_&>,_QLatin1String>,_QLatin1Char>,_QString>,_QLatin1Char>,_QString_&>_>
  ::appendTo<QChar>((type *)b,&local_38);
  pQVar2 = &(b->a).b;
  lVar10 = pQVar2->m_size;
  QAbstractConcatenable::appendLatin1To(*pQVar2,local_38);
  local_38 = local_38 + lVar10;
  lVar10 = (b->b).m_size;
  QAbstractConcatenable::appendLatin1To(b->b,local_38);
  local_38 = local_38 + lVar10;
  QString::resize((longlong)a);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return a;
  }
  __stack_chk_fail();
}

Assistant:

QString &operator+=(QString &a, const QStringBuilder<A, B> &b)
{
    qsizetype len = a.size() + QConcatenable< QStringBuilder<A, B> >::size(b);
    a.detach(); // a detach() in a.data() could reset a.capacity() to a.size()
    if (len > a.data_ptr().freeSpaceAtEnd()) // capacity() was broken when prepend()-optimization landed
        a.reserve(qMax(len, 2 * a.capacity()));
    QChar *it = a.data() + a.size();
    QConcatenable< QStringBuilder<A, B> >::appendTo(b, it);
    // we need to resize after the appendTo for the case str+=foo+str
    a.resize(it - a.constData()); //may be smaller than len if there was conversion from utf8
    return a;
}